

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O1

int rtosc::canonicalize_arg_vals(rtosc_arg_val_t *av,size_t n,char *port_args,MetaContainer meta)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  rtosc_arg_val_t *prVar6;
  ulong uVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  byte *pbVar11;
  bool bVar13;
  bool bVar14;
  int local_60;
  byte *pbVar12;
  
  while (((byte)*port_args - 0x3a < 0x24 &&
         ((0xa00000001U >> ((ulong)((byte)*port_args - 0x3a) & 0x3f) & 1) != 0))) {
    port_args = (char *)((byte *)port_args + 1);
  }
  cVar1 = av->type;
  uVar5 = CONCAT71(0xa000000,cVar1);
  uVar7 = 1;
  prVar6 = av;
  sVar8 = n;
  if (cVar1 == 'a') {
    uVar3 = rtosc_av_arr_len(av);
    uVar5 = (ulong)uVar3;
    uVar7 = (ulong)(int)uVar3;
    prVar6 = av + 1;
    sVar8 = 1;
  }
  iVar4 = (int)uVar5;
  bVar14 = uVar7 != 0;
  if (bVar14) {
    uVar10 = 0;
    do {
      bVar13 = sVar8 != 0;
      if (sVar8 != 0) {
        uVar9 = 0;
        pbVar12 = (byte *)port_args;
LAB_00105525:
        do {
          pbVar11 = pbVar12 + 1;
          bVar2 = *pbVar12;
          pbVar12 = pbVar11;
          if (bVar2 < 0x5d) {
            if (bVar2 == 0x5b) goto LAB_00105525;
            if ((bVar2 == 0) || (bVar2 == 0x3a)) {
              uVar5 = (ulong)(uint)((int)n - (int)uVar9);
              break;
            }
          }
          else if (bVar2 == 0x5d) goto LAB_00105525;
          if ((bVar2 == 0x69) && (prVar6->type == 'S')) {
            iVar4 = enum_key(meta,(prVar6->val).s);
            prVar6->type = 'i';
            (prVar6->val).i = iVar4;
            uVar5 = uVar5 & 0xffffffff;
          }
          uVar9 = uVar9 + 1;
          prVar6 = prVar6 + 1;
          bVar13 = uVar9 < sVar8;
        } while (uVar9 != sVar8);
      }
      iVar4 = (int)uVar5;
      if (bVar13) break;
      uVar10 = uVar10 + 1;
      bVar14 = uVar10 < uVar7;
    } while (uVar10 != uVar7);
  }
  local_60 = 0;
  if ((!bVar14) && (iVar4 = local_60, uVar7 != 0 && cVar1 == 'a')) {
    rtosc_av_arr_type_set(av,prVar6[-1].type);
  }
  return iVar4;
}

Assistant:

int rtosc::canonicalize_arg_vals(rtosc_arg_val_t* av, size_t n,
                                 const char* port_args,
                                 Port::MetaContainer meta)
{
    const char* first0 = port_args;
    int errors_found = 0;

    // skip "[]:"
    for( ; *first0 && (*first0 == ':' || *first0 == '[' || *first0 == ']');
           ++first0) ;

    size_t arr_size;
    size_t max;
    bool is_array;
    rtosc_arg_val_t* start = av;
    if(av->type == 'a') {
        arr_size = rtosc_av_arr_len(av);
        ++av;
        max = 1; // only one element per bundle element
                 // TODO: multiple may be possible
        is_array = true;
    }
    else {
        arr_size = 1;
        max = n;
        is_array = false;
    }

    for(size_t a = 0; a < arr_size; ++a)
    {
        const char* first = first0;
        for(size_t i = 0; i < max; ++i, ++first, ++av)
        {
            // skip "[]"
            for( ; *first && (*first == '[' || *first == ']'); ++first) ;

            assert(!strchr(first0, '#'));

//            if(is_array) // TODO: currently, only one element per bundle element
//                assert(first[1] == 0);

            if(!*first || *first == ':')
            {
                // (n-i) arguments left, but we have no recipe to convert them
                return n-i;
            }

            if(av->type == 'S' && *first == 'i')
            {
                int val = enum_key(meta, av->val.s);
                if(val == std::numeric_limits<int>::min())
                    ++errors_found;
                else
                {
                    av->type = 'i';
                    av->val.i = val;
                }
            }
        }
    }
    if(is_array && arr_size)
        rtosc_av_arr_type_set(start, av[-1].type);

    return errors_found;
}